

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QString>_>::reallocate
          (QMovableArrayOps<std::pair<QString,_QString>_> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QTypedArrayData<std::pair<QString,_QString>_>_*,_std::pair<QString,_QString>_*> pVar1;
  
  pVar1 = QTypedArrayData<std::pair<QString,_QString>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
                     super_QArrayDataPointer<std::pair<QString,_QString>_>.d,
                     (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
                     super_QArrayDataPointer<std::pair<QString,_QString>_>.ptr,alloc,option);
  (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
  super_QArrayDataPointer<std::pair<QString,_QString>_>.d = pVar1.first;
  (this->super_QGenericArrayOps<std::pair<QString,_QString>_>).
  super_QArrayDataPointer<std::pair<QString,_QString>_>.ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }